

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::NodeImpl(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *this,Type type,SingleAttribute<avro::Name> *name,
          MultiAttribute<boost::shared_ptr<avro::Node>_> *leaves,
          MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *leafNames,NoAttribute<int> *size)

{
  Type in_ESI;
  Node *in_RDI;
  SingleAttribute<avro::Name> *in_stack_ffffffffffffffa8;
  Node *rhs;
  
  Node::Node(in_RDI,in_ESI);
  in_RDI->_vptr_Node = (_func_int **)&PTR__NodeImpl_002640d0;
  concepts::SingleAttribute<avro::Name>::SingleAttribute
            ((SingleAttribute<avro::Name> *)in_RDI,in_stack_ffffffffffffffa8);
  rhs = in_RDI + 5;
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::MultiAttribute
            ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)in_RDI,
             (MultiAttribute<boost::shared_ptr<avro::Node>_> *)rhs);
  concepts::
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  MultiAttribute((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI,
                 (MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)rhs);
  concepts::
  NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::NameIndexConcept((NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1ee03b);
  return;
}

Assistant:

NodeImpl(Type type, 
             const NameConcept &name, 
             const LeavesConcept &leaves, 
             const LeafNamesConcept &leafNames,
             const SizeConcept &size) :
        Node(type),
        nameAttribute_(name),
        leafAttributes_(leaves),
        leafNameAttributes_(leafNames),
        sizeAttribute_(size)
    { }